

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

usize __thiscall
Console::Prompt::Private::readUnbufferedEscapedSequence(Private *this,char *seqStart,char *buffer)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  char *pcVar5;
  char local_29;
  char *pcStack_28;
  char ch;
  char *start;
  char *buffer_local;
  char *seqStart_local;
  Private *this_local;
  
  pcStack_28 = buffer;
  start = buffer;
  buffer_local = seqStart;
  seqStart_local = &this->valid;
  do {
    sVar4 = read(0,&local_29,1);
    if ((sVar4 != 1) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                              ,0x47d,"read(STDIN_FILENO, &ch, 1) == 1"), iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pcVar5 = start + 1;
    *start = local_29;
    start = pcVar5;
  } while ((buffer_local[1] == '[') && (bVar2 = isSeqAttributeChar(local_29), bVar2));
  *start = '\0';
  return (long)start - (long)pcStack_28;
}

Assistant:

usize readUnbufferedEscapedSequence(const char* seqStart, char* buffer)
  {
    for(char* start = buffer, ch;;)
    {
      VERIFY(read(STDIN_FILENO, &ch, 1) == 1);
      *(buffer++) = ch;
      if(seqStart[1] != '[' || !isSeqAttributeChar(ch))
      {
        *buffer = '\0';
        return buffer - start;
      }
    }
  }